

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib597.c
# Opt level: O3

int test(char *URL)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  FILE *pFVar11;
  timeval tVar12;
  int running;
  int msgs_left;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_1e8;
  int local_1e4;
  ulong local_1e0;
  char *local_1d8;
  timeval local_1d0;
  undefined1 local_1bc [4];
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1d8 = URL;
  tv_test_start = tutil_tvnow();
  uVar2 = curl_global_init(3);
  if (uVar2 != 0) {
    test_cold_1();
    goto LAB_00102ab0;
  }
  lVar5 = curl_easy_init();
  if (lVar5 == 0) {
    test_cold_14();
    uVar2 = 0x7c;
LAB_00102ae5:
    lVar6 = 0;
  }
  else {
    lVar6 = curl_multi_init();
    if (lVar6 == 0) {
      test_cold_13();
      uVar2 = 0x7b;
      goto LAB_00102ae5;
    }
    uVar2 = curl_easy_setopt(lVar5,0x29,1);
    if (uVar2 == 0) {
      bVar1 = true;
      do {
        uVar2 = curl_easy_setopt(lVar5,0x2712,local_1d8);
        if (uVar2 != 0) {
          test_cold_2();
          goto LAB_00102a9b;
        }
        if (bVar1) {
          uVar2 = curl_easy_setopt(lVar5,0x8d,1);
          if (uVar2 != 0) {
            test_cold_6();
            goto LAB_00102a9b;
          }
        }
        else {
          uVar2 = curl_easy_setopt(lVar5,0x8d,0);
          if (uVar2 != 0) {
            test_cold_3();
            goto LAB_00102a9b;
          }
          uVar2 = curl_easy_setopt(lVar5,0x2c,1);
          if (uVar2 != 0) {
            test_cold_4();
            goto LAB_00102a9b;
          }
          uVar2 = curl_easy_setopt(lVar5,0x4b,1);
          if (uVar2 != 0) {
            test_cold_5();
            goto LAB_00102a9b;
          }
        }
        uVar2 = curl_multi_add_handle(lVar6,lVar5);
        if (uVar2 != 0) {
          test_cold_7();
          goto LAB_00102a9b;
        }
LAB_001026fd:
        local_1e0 = 0xffffffffffffff9d;
        local_1e8 = -99;
        uVar2 = curl_multi_perform(lVar6,&local_1e4);
        pFVar11 = _stderr;
        if (uVar2 != 0) {
          uVar9 = curl_multi_strerror(uVar2);
          pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uVar8 = 0x60;
          goto LAB_001029dd;
        }
        if (local_1e4 < 0) {
          pcVar10 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uVar9 = 0x60;
LAB_00102a3d:
          fprintf(_stderr,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                  ,uVar9);
          uVar2 = 0x7a;
          goto LAB_00102a9b;
        }
        tVar12 = tutil_tvnow();
        lVar7 = tutil_tvdiff(tVar12,tv_test_start);
        if (5000 < lVar7) {
          test_cold_8();
          goto LAB_00102a92;
        }
        if (local_1e4 != 0) {
          local_1b8.__fds_bits[0xe] = 0;
          local_1b8.__fds_bits[0xf] = 0;
          local_1b8.__fds_bits[0xc] = 0;
          local_1b8.__fds_bits[0xd] = 0;
          local_1b8.__fds_bits[10] = 0;
          local_1b8.__fds_bits[0xb] = 0;
          local_1b8.__fds_bits[8] = 0;
          local_1b8.__fds_bits[9] = 0;
          local_1b8.__fds_bits[6] = 0;
          local_1b8.__fds_bits[7] = 0;
          local_1b8.__fds_bits[4] = 0;
          local_1b8.__fds_bits[5] = 0;
          local_1b8.__fds_bits[2] = 0;
          local_1b8.__fds_bits[3] = 0;
          local_1b8.__fds_bits[0] = 0;
          local_1b8.__fds_bits[1] = 0;
          local_b8.__fds_bits[0] = 0;
          local_b8.__fds_bits[1] = 0;
          local_b8.__fds_bits[2] = 0;
          local_b8.__fds_bits[3] = 0;
          local_b8.__fds_bits[4] = 0;
          local_b8.__fds_bits[5] = 0;
          local_b8.__fds_bits[6] = 0;
          local_b8.__fds_bits[7] = 0;
          local_b8.__fds_bits[8] = 0;
          local_b8.__fds_bits[9] = 0;
          local_b8.__fds_bits[10] = 0;
          local_b8.__fds_bits[0xb] = 0;
          local_b8.__fds_bits[0xc] = 0;
          local_b8.__fds_bits[0xd] = 0;
          local_b8.__fds_bits[0xe] = 0;
          local_b8.__fds_bits[0xf] = 0;
          local_138.__fds_bits[0] = 0;
          local_138.__fds_bits[1] = 0;
          local_138.__fds_bits[2] = 0;
          local_138.__fds_bits[3] = 0;
          local_138.__fds_bits[4] = 0;
          local_138.__fds_bits[5] = 0;
          local_138.__fds_bits[6] = 0;
          local_138.__fds_bits[7] = 0;
          local_138.__fds_bits[8] = 0;
          local_138.__fds_bits[9] = 0;
          local_138.__fds_bits[10] = 0;
          local_138.__fds_bits[0xb] = 0;
          local_138.__fds_bits[0xc] = 0;
          local_138.__fds_bits[0xd] = 0;
          local_138.__fds_bits[0xe] = 0;
          local_138.__fds_bits[0xf] = 0;
          uVar2 = curl_multi_fdset(lVar6,&local_1b8,&local_b8,&local_138,&local_1e8);
          if (uVar2 == 0) {
            if (local_1e8 < -1) {
              pcVar10 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar9 = 0x6b;
              goto LAB_00102a3d;
            }
            uVar2 = curl_multi_timeout(lVar6,&local_1e0);
            if (uVar2 == 0) {
              if ((long)local_1e0 < -1) {
                fprintf(_stderr,
                        "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                        ,0x6f);
                uVar2 = 0x73;
              }
              else {
                if (local_1e0 == 0xffffffffffffffff) {
                  local_1d0.tv_sec = 6;
                  local_1d0.tv_usec = 0;
                }
                else {
                  local_1d0.tv_sec = local_1e0 / 1000;
                  local_1d0.tv_usec = (local_1e0 % 1000) * 1000;
                }
                iVar3 = select_wrapper(local_1e8 + 1,&local_1b8,&local_b8,&local_138,&local_1d0);
                if (iVar3 != -1) goto code_r0x001028d8;
                test_cold_12();
                uVar2 = 0x79;
              }
            }
            else {
              test_cold_10();
            }
          }
          else {
            test_cold_9();
          }
          goto LAB_00102a9b;
        }
        lVar7 = curl_multi_info_read(lVar6,local_1bc);
        if (lVar7 == 0) {
          uVar4 = curl_multi_remove_handle(lVar6,lVar5);
          if (uVar4 != 0) goto LAB_00102b04;
          if (!bVar1) {
            uVar2 = 0;
            goto LAB_00102a9b;
          }
        }
        else {
          uVar2 = *(uint *)(lVar7 + 0x10);
          uVar4 = curl_multi_remove_handle(lVar6,lVar5);
          if (uVar4 != 0) {
LAB_00102b04:
            pFVar11 = _stderr;
            uVar9 = curl_multi_strerror(uVar4);
            fprintf(pFVar11,"%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                    ,0x85,(ulong)uVar4,uVar9);
            uVar2 = uVar4;
            goto LAB_00102a9b;
          }
          if (!(bool)(bVar1 & uVar2 == 0)) goto LAB_00102a9b;
        }
        bVar1 = false;
        uVar2 = curl_easy_setopt(lVar5,0x29,1);
      } while (uVar2 == 0);
    }
    pFVar11 = _stderr;
    uVar9 = curl_easy_strerror(uVar2);
    pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    uVar8 = 0x46;
LAB_001029dd:
    fprintf(pFVar11,pcVar10,
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
            ,uVar8,(ulong)uVar2,uVar9);
  }
LAB_00102a9b:
  curl_multi_cleanup(lVar6);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
LAB_00102ab0:
  return uVar2;
code_r0x001028d8:
  tVar12 = tutil_tvnow();
  lVar7 = tutil_tvdiff(tVar12,tv_test_start);
  if (5000 < lVar7) {
    test_cold_11();
LAB_00102a92:
    uVar2 = 0x7d;
    goto LAB_00102a9b;
  }
  goto LAB_001026fd;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  int phase;
  CURLMsg *msg;

  start_test_timing();

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    return res;
  }

  easy_init(easy);

  multi_init(multi);

  for (phase = CONNECT_ONLY_PHASE; phase < LAST_PHASE; ++phase) {
    /* go verbose */
    easy_setopt(easy, CURLOPT_VERBOSE, 1L);

    /* specify target */
    easy_setopt(easy, CURLOPT_URL, URL);

    /* enable 'CONNECT_ONLY' option when in connect phase */
    if (phase == CONNECT_ONLY_PHASE)
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 1L);

    /* enable 'NOBODY' option to send 'QUIT' command in quit phase */
    if (phase == QUIT_PHASE) {
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 0L);
      easy_setopt(easy, CURLOPT_NOBODY, 1L);
      easy_setopt(easy, CURLOPT_FORBID_REUSE, 1L);
    }

    multi_add_handle(multi, easy);

    for(;;) {
      struct timeval interval;
      fd_set fdread;
      fd_set fdwrite;
      fd_set fdexcep;
      long timeout = -99;
      int maxfd = -99;

      multi_perform(multi, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&fdread);
      FD_ZERO(&fdwrite);
      FD_ZERO(&fdexcep);

      multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      multi_timeout(multi, &timeout);

      /* At this point, timeout is guaranteed to be greater or equal than -1. */

      if(timeout != -1L) {
        interval.tv_sec = timeout/1000;
        interval.tv_usec = (timeout%1000)*1000;
      }
      else {
        interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
        interval.tv_usec = 0;
      }

      select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

      abort_on_test_timeout();
    }

    msg = curl_multi_info_read(multi, &msgs_left);
    if(msg)
      res = msg->data.result;

    multi_remove_handle(multi, easy);
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}